

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<float> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  int iVar8;
  pointer __s;
  pointer pcVar9;
  uint uVar10;
  significand_type sVar11;
  pointer pcVar12;
  long lVar13;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_79 [5];
  sign_t local_74;
  int local_70;
  uint local_6c;
  decimal_fp<float> local_68;
  undefined1 local_5c [4];
  anon_class_56_7_a2a26a24 local_58;
  
  local_6c = fp->significand;
  uVar4 = 0x1f;
  if ((local_6c | 1) != 0) {
    for (; (local_6c | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  local_70 = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar4 * 2) -
             (uint)(local_6c <
                   *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                            (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar4 * 2) * 4));
  local_68.exponent = fspecs._4_4_;
  local_74 = (uint)local_68.exponent >> 8 & 0xff;
  uVar7 = (ulong)((uint)(local_74 != none) + local_70);
  uVar4 = fp->exponent;
  local_5c = (undefined1  [4])(uVar4 + local_70);
  local_68.significand = fspecs.precision;
  local_79[0] = decimal_point;
  local_68 = (decimal_fp<float>)fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_001225e9:
    iVar8 = uVar4 + local_70 + -1;
    if (((uint)local_68.exponent >> 0x14 & 1) == 0) {
      uVar5 = 0;
      if (local_70 == 1) {
        local_79[0] = '\0';
      }
    }
    else {
      uVar5 = 0;
      if (0 < (int)(local_68.significand - local_70)) {
        uVar5 = (ulong)(local_68.significand - local_70);
      }
      uVar7 = uVar7 + uVar5;
    }
    iVar3 = 1 - (int)local_5c;
    if (0 < (int)local_5c) {
      iVar3 = iVar8;
    }
    lVar13 = 2;
    if (99 < iVar3) {
      lVar13 = (ulong)(999 < iVar3) + 3;
    }
    sVar6 = (3 - (ulong)(local_79[0] == '\0')) + uVar7 + lVar13;
    local_58.sign = (sign_t *)(CONCAT44(local_6c,(uint)local_68.exponent >> 8) & 0xffffffff000000ff)
    ;
    local_58.significand._0_5_ = CONCAT14(local_79[0],local_70);
    local_58.significand_size =
         (int *)(CONCAT35(local_58.significand_size._5_3_,
                          CONCAT14((((uint)local_68.exponent >> 0x10 & 1) == 0) << 5,(int)uVar5)) |
                0x4500000000);
    local_58.fp = (decimal_fp<float> *)CONCAT44(local_58.fp._4_4_,iVar8);
    if (specs->width < 1) {
      sVar1 = (out.container)->_M_string_length;
      std::__cxx11::string::resize((ulong)out.container,(char)sVar6 + (char)sVar1);
      pcVar12 = ((out.container)->_M_dataplus)._M_p + sVar1;
      if (((ulong)local_58.sign & 0xffffffff) != 0) {
        *pcVar12 = *(char *)((long)&basic_data<void>::signs + ((ulong)local_58.sign & 0xffffffff));
        pcVar12 = pcVar12 + 1;
      }
      if (local_58.significand._4_1_ == '\0') {
        __s = pcVar12 + (int)local_58.significand;
        pcVar12 = __s;
        uVar4 = local_58.sign._4_4_;
        uVar10 = local_58.sign._4_4_;
        if (99 < local_58.sign._4_4_) {
          do {
            uVar10 = uVar4 / 100;
            *(undefined2 *)(pcVar12 + -2) =
                 *(undefined2 *)(&basic_data<void>::digits + (ulong)(uVar4 % 100) * 2);
            pcVar12 = pcVar12 + -2;
            bVar2 = 9999 < uVar4;
            uVar4 = uVar4 / 100;
          } while (bVar2);
        }
        if (uVar10 < 10) {
          pcVar12[-1] = (byte)uVar10 | 0x30;
        }
        else {
          *(undefined2 *)(pcVar12 + -2) =
               *(undefined2 *)(&basic_data<void>::digits + (ulong)uVar10 * 2);
        }
      }
      else {
        __s = pcVar12 + (long)(int)local_58.significand + 1;
        pcVar9 = __s;
        uVar4 = local_58.sign._4_4_;
        uVar10 = local_58.sign._4_4_;
        if (99 < local_58.sign._4_4_) {
          do {
            uVar10 = uVar4 / 100;
            *(undefined2 *)(pcVar9 + -2) =
                 *(undefined2 *)(&basic_data<void>::digits + (ulong)(uVar4 % 100) * 2);
            pcVar9 = pcVar9 + -2;
            bVar2 = 9999 < uVar4;
            uVar4 = uVar4 / 100;
          } while (bVar2);
        }
        if (uVar10 < 10) {
          pcVar9[-1] = (byte)uVar10 | 0x30;
        }
        else {
          *(undefined2 *)(pcVar9 + -2) =
               *(undefined2 *)(&basic_data<void>::digits + (ulong)uVar10 * 2);
        }
        *pcVar12 = pcVar12[1];
        pcVar12[1] = local_58.significand._4_1_;
      }
      __n = (size_t)(int)local_58.significand_size;
      pcVar12 = __s;
      if (0 < (long)__n) {
        pcVar12 = __s + __n;
        memset(__s,0x30,__n);
      }
      *pcVar12 = local_58.significand_size._4_1_;
      write_exponent<char,char*>((int)local_58.fp,pcVar12 + 1);
    }
    else {
      out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                      (out,specs,sVar6,sVar6,(anon_class_28_7_94dcc806 *)&local_58);
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      sVar11 = 0x10;
      if (0 < (int)local_68.significand) {
        sVar11 = local_68.significand;
      }
      if (((int)local_5c < -3) || ((int)sVar11 < (int)local_5c)) goto LAB_001225e9;
    }
    if ((int)uVar4 < 0) {
      if ((int)local_5c < 1) {
        sVar11 = -(int)local_5c;
        local_58.fp = &local_68;
        local_79._1_4_ = sVar11;
        if (SBORROW4(local_68.significand,sVar11) != (int)(local_68.significand + (int)local_5c) < 0
           ) {
          local_79._1_4_ = local_68.significand;
        }
        if ((int)local_68.significand < 0) {
          local_79._1_4_ = sVar11;
        }
        if (local_70 != 0) {
          local_79._1_4_ = sVar11;
        }
        local_58.significand = (significand_type *)(local_79 + 1);
        sVar6 = (local_79._1_4_ + 2) + uVar7;
        local_58.sign = &local_74;
        local_58.significand_size = &local_70;
        local_58.fspecs = (float_specs *)local_79;
        local_58.decimal_point = (char *)&local_6c;
        out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                        (out,specs,sVar6,sVar6,(anon_class_48_6_9afe1116 *)&local_58);
      }
      else {
        local_79._1_4_ = local_68.significand - local_70 & (local_68.exponent << 0xb) >> 0x1f;
        local_58.decimal_point = local_79 + 1;
        uVar5 = (ulong)(uint)local_79._1_4_;
        if ((int)local_79._1_4_ < 1) {
          uVar5 = 0;
        }
        sVar6 = uVar5 + 1 + uVar7;
        local_58.sign = &local_74;
        local_58.significand = &local_6c;
        local_58.significand_size = &local_70;
        local_58.fp = (decimal_fp<float> *)local_5c;
        local_58.fspecs = (float_specs *)local_79;
        out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar6,sVar6,(anon_class_48_6_48d028d1 *)&local_58);
      }
    }
    else {
      sVar6 = uVar7 + uVar4;
      local_79._1_4_ = local_68.significand - (int)local_5c;
      if (((uint)local_68.exponent >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ != '\x02') && ((int)local_79._1_4_ < 1)) {
          local_79._1_4_ = 1;
        }
        if (0 < (long)(int)local_79._1_4_) {
          sVar6 = sVar6 + (long)(int)local_79._1_4_;
        }
      }
      local_58.sign = &local_74;
      local_58.significand = &local_6c;
      local_58.significand_size = &local_70;
      local_58.fspecs = (float_specs *)&local_68;
      local_58.decimal_point = local_79;
      local_58.num_zeros = (int *)(local_79 + 1);
      local_58.fp = fp;
      out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                      (out,specs,sVar6,sVar6,&local_58);
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}